

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

IDiagObjectAddress * __thiscall
Js::RecyclableObjectWalker::FindPropertyAddress
          (RecyclableObjectWalker *this,PropertyId propertyId,bool *isConst)

{
  Var _parentObj;
  Var _value;
  code *pcVar1;
  uint _propId;
  bool bVar2;
  int iVar3;
  int iVar4;
  Type *ppDVar5;
  undefined4 *puVar6;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar7;
  RecyclableObjectAddress *this_00;
  Type *ppIVar8;
  undefined4 extraout_var;
  IDiagObjectAddress *address;
  int i_1;
  TrackAllocData local_60;
  Type local_38;
  DebuggerPropertyDisplayInfo *pair;
  bool *pbStack_28;
  int i;
  bool *isConst_local;
  RecyclableObjectWalker *pRStack_18;
  PropertyId propertyId_local;
  RecyclableObjectWalker *this_local;
  
  pbStack_28 = isConst;
  isConst_local._4_4_ = propertyId;
  pRStack_18 = this;
  (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])();
  if (this->pMembersList !=
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    for (pair._4_4_ = 0; iVar4 = pair._4_4_,
        iVar3 = JsUtil::
                ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                ::Count(&this->pMembersList->
                         super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                       ), iVar4 < iVar3; pair._4_4_ = pair._4_4_ + 1) {
      ppDVar5 = JsUtil::
                List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pMembersList,pair._4_4_);
      local_38 = *ppDVar5;
      if (local_38 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x93f,"(pair)","pair");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (local_38->propId == isConst_local._4_4_) {
        bVar2 = DebuggerPropertyDisplayInfo::IsConst(local_38);
        *pbStack_28 = bVar2;
        pAVar7 = &GetArenaFromContext(this->scriptContext)->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_60,(type_info *)&RecyclableObjectAddress::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0x948);
        pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar7,&local_60);
        this_00 = (RecyclableObjectAddress *)
                  new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar7,0x3f67b0);
        _propId = isConst_local._4_4_;
        _parentObj = this->instance;
        _value = local_38->aVar;
        bVar2 = DebuggerPropertyDisplayInfo::IsInDeadZone(local_38);
        RecyclableObjectAddress::RecyclableObjectAddress
                  (this_00,_parentObj,_propId,_value,(uint)bVar2);
        return &this_00->super_IDiagObjectAddress;
      }
    }
  }
  if (this->fakeGroupObjectWalkerList !=
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    for (address._4_4_ = 0;
        iVar4 = JsUtil::
                ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ::Count(&this->fakeGroupObjectWalkerList->
                         super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                       ), address._4_4_ < iVar4; address._4_4_ = address._4_4_ + 1) {
      ppIVar8 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->fakeGroupObjectWalkerList,address._4_4_);
      iVar4 = (*(*ppIVar8)->_vptr_IDiagObjectModelWalkerBase[3])
                        (*ppIVar8,(ulong)isConst_local._4_4_,pbStack_28);
      if ((IDiagObjectAddress *)CONCAT44(extraout_var,iVar4) != (IDiagObjectAddress *)0x0) {
        return (IDiagObjectAddress *)CONCAT44(extraout_var,iVar4);
      }
    }
  }
  return (IDiagObjectAddress *)0x0;
}

Assistant:

IDiagObjectAddress *RecyclableObjectWalker::FindPropertyAddress(PropertyId propertyId, bool& isConst)
    {
        GetChildrenCount(); // Ensure to populate members

        if (pMembersList != nullptr)
        {
            for (int i = 0; i < pMembersList->Count(); i++)
            {
                DebuggerPropertyDisplayInfo *pair = pMembersList->Item(i);
                Assert(pair);
                if (pair->propId == propertyId)
                {
                    isConst = pair->IsConst();
                    return Anew(GetArenaFromContext(scriptContext),
                        RecyclableObjectAddress,
                        instance,
                        propertyId,
                        pair->aVar,
                        pair->IsInDeadZone() ? TRUE : FALSE);
                }
            }
        }

        // Following is for "with object" scope lookup. We may have members in [Methods] group or prototype chain that need to
        // be exposed to expression evaluation.
        if (fakeGroupObjectWalkerList != nullptr)
        {
            // WARNING: Following depends on [Methods] group being before [prototype] group. We need to check local [Methods] group
            // first for local properties before going to prototype chain.
            for (int i = 0; i < fakeGroupObjectWalkerList->Count(); i++)
            {
                IDiagObjectAddress* address = fakeGroupObjectWalkerList->Item(i)->FindPropertyAddress(propertyId, isConst);
                if (address != nullptr)
                {
                    return address;
                }
            }
        }

        return nullptr;
    }